

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O0

void __thiscall
nv::SlowCompressor::compressDXT3
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Color32 *pCVar4;
  scalar r;
  scalar g;
  scalar b;
  undefined1 local_588 [8];
  ColourSet colours;
  uint local_230;
  uint local_22c;
  uint x;
  uint y;
  WeightedClusterFit fit;
  BlockDXT3 block;
  ColorBlock rgba;
  uint h;
  uint w;
  Private *outputOptions_local;
  Private *compressionOptions_local;
  SlowCompressor *this_local;
  
  uVar2 = Image::width(this->m_image);
  uVar3 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&block.color);
  BlockDXT3::BlockDXT3((BlockDXT3 *)(fit.m_order + 0xe));
  squish::WeightedClusterFit::WeightedClusterFit((WeightedClusterFit *)&x);
  r = Vector4::x(&compressionOptions->colorWeight);
  g = Vector4::y(&compressionOptions->colorWeight);
  b = Vector4::z(&compressionOptions->colorWeight);
  squish::WeightedClusterFit::SetMetric((WeightedClusterFit *)&x,r,g,b);
  for (local_22c = 0; local_22c < uVar3; local_22c = local_22c + 4) {
    for (local_230 = 0; local_230 < uVar2; local_230 = local_230 + 4) {
      ColorBlock::init((ColorBlock *)&block.color,(EVP_PKEY_CTX *)this->m_image);
      OptimalCompress::compressDXT3A
                ((ColorBlock *)&block.color,(AlphaBlockDXT3 *)(fit.m_order + 0xe));
      bVar1 = ColorBlock::isSingleColor((ColorBlock *)&block.color);
      if (bVar1) {
        pCVar4 = ColorBlock::color((ColorBlock *)&block.color,0);
        Color32::Color32((Color32 *)(colours.m_weights_simd[0xf].m_v + 3),pCVar4);
        OptimalCompress::compressDXT1
                  ((Color32 *)(colours.m_weights_simd[0xf].m_v + 3),(BlockDXT1 *)&block);
      }
      else {
        pCVar4 = ColorBlock::colors((ColorBlock *)&block.color);
        squish::ColourSet::ColourSet((ColourSet *)local_588,(u8 *)pCVar4,0x80,false);
        squish::WeightedClusterFit::SetColourSet((WeightedClusterFit *)&x,(ColourSet *)local_588,0);
        squish::ColourFit::Compress((ColourFit *)&x,&block);
      }
      if (outputOptions->outputHandler != (OutputHandler *)0x0) {
        (*outputOptions->outputHandler->_vptr_OutputHandler[3])
                  (outputOptions->outputHandler,fit.m_order + 0xe,0x10);
      }
    }
  }
  return;
}

Assistant:

void nv::SlowCompressor::compressDXT3(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT3 block;
	
	squish::WeightedClusterFit fit;
	//squish::FastClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			// Compress explicit alpha.
			OptimalCompress::compressDXT3A(rgba, &block.alpha);

			// Compress color.
			if (rgba.isSingleColor())
			{
				OptimalCompress::compressDXT1(rgba.color(0), &block.color);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), squish::kWeightColourByAlpha);
				fit.SetColourSet(&colours, 0);
				fit.Compress(&block.color);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}